

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O3

Mat * __thiscall
ncnn::ModelBin::load(Mat *__return_storage_ptr__,ModelBin *this,int w,int h,int c,int type)

{
  Mat local_60;
  
  (**this->_vptr_ModelBin)(&local_60,this,(ulong)(uint)(h * w * c),type);
  if ((local_60.data == (void *)0x0) || ((long)local_60.c * local_60.cstep == 0)) {
    __return_storage_ptr__->data = local_60.data;
    __return_storage_ptr__->refcount = local_60.refcount;
    __return_storage_ptr__->elemsize = local_60.elemsize;
    __return_storage_ptr__->allocator = local_60.allocator;
    __return_storage_ptr__->dims = local_60.dims;
    if (local_60.refcount != (int *)0x0) {
      LOCK();
      *local_60.refcount = *local_60.refcount + 1;
      UNLOCK();
    }
    __return_storage_ptr__->w = local_60.w;
    __return_storage_ptr__->h = local_60.h;
    __return_storage_ptr__->c = local_60.c;
    __return_storage_ptr__->cstep = local_60.cstep;
  }
  else {
    Mat::reshape(__return_storage_ptr__,&local_60,w,h,c,(Allocator *)0x0);
  }
  if (local_60.refcount != (int *)0x0) {
    LOCK();
    *local_60.refcount = *local_60.refcount + -1;
    UNLOCK();
    if (*local_60.refcount == 0) {
      if (local_60.allocator == (Allocator *)0x0) {
        if (local_60.data != (void *)0x0) {
          free(*(void **)((long)local_60.data + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_60.allocator + 8))();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBin::load(int w, int h, int c, int type) const
{
    Mat m = load(w * h * c, type);
    if (m.empty())
        return m;

    return m.reshape(w, h, c);
}